

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O2

string * __thiscall
cmMakefile::GetModulesFile(string *__return_storage_ptr__,cmMakefile *this,string *name)

{
  bool system;
  string debugBuffer;
  bool local_29;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  GetModulesFile(__return_storage_ptr__,this,name,&local_29,false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string GetModulesFile(const std::string& name) const
  {
    bool system;
    std::string debugBuffer;
    return this->GetModulesFile(name, system, false, debugBuffer);
  }